

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

int __thiscall Polynomial::createPlusNode(Polynomial *this,int first_loc,int second_loc)

{
  int iVar1;
  iterator __position;
  int iVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> args;
  allocator_type local_51;
  operand local_50;
  vector<int,_std::allocator<int>_> local_30;
  
  this->mResultLocation =
       (int)((ulong)((long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar1 = this->mNumStates;
  if (second_loc < iVar1 && first_loc < iVar1) {
    iVar2 = 0;
    if (iVar1 <= second_loc + first_loc) {
      iVar2 = iVar1;
    }
    second_loc = (second_loc + first_loc) - iVar2;
  }
  else if (first_loc != 0) {
    if (second_loc == 0) {
      this->mResultLocation = first_loc;
    }
    else {
      __l._M_len = 2;
      __l._M_array = (iterator)&local_50;
      local_50.op = first_loc;
      local_50._4_4_ = second_loc;
      std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_51);
      local_50.op = PLUS;
      std::vector<int,_std::allocator<int>_>::vector(&local_50.args,&local_30);
      std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::
      emplace_back<Polynomial::operand>(&this->mOperands,&local_50);
      if (local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_50.op = PLUS;
      __position._M_current =
           (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->mEvaluationValues,__position,(int *)&local_50);
      }
      else {
        *__position._M_current = 0;
        (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    goto LAB_00106fe7;
  }
  this->mResultLocation = second_loc;
LAB_00106fe7:
  return this->mResultLocation;
}

Assistant:

int Polynomial::createPlusNode(int first_loc, int second_loc)
{
  mResultLocation = mEvaluationValues.size();
  if (isConstantLocation(first_loc) and isConstantLocation(second_loc))
    {
      // evaluate now, because they are constants
      int val = first_loc + second_loc;
      if (val >= mNumStates) val -= mNumStates;
      mResultLocation = val;
    }
  else if (first_loc == 0)
    mResultLocation = second_loc;
  else if (second_loc == 0)
    mResultLocation = first_loc;
  else
    {
      std::vector<int> args { first_loc, second_loc};
      mOperands.push_back({operandType::PLUS, args});
      mEvaluationValues.push_back(0); // make space in evaluation array for the output.
    }
  return mResultLocation;
}